

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  char cVar1;
  ExprType EVar2;
  Opcode OVar3;
  pointer pNVar4;
  Var *pVVar5;
  pointer pcVar6;
  uint64_t uVar7;
  Expr *pEVar8;
  VarExpr<(wabt::ExprType)26> *ve;
  const_iterator cVar9;
  Expr *pEVar10;
  string_view postfix;
  string_view postfix_00;
  string_view postfix_01;
  string_view postfix_02;
  string_view postfix_03;
  string_view postfix_04;
  Location *pLVar11;
  pointer child;
  Value *__return_storage_ptr___00;
  int iVar12;
  long *plVar13;
  mapped_type *pmVar14;
  Type TVar15;
  undefined8 *puVar16;
  Expr *pEVar17;
  uint *args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  size_t sVar19;
  Expr *pEVar20;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  undefined8 uVar25;
  char *pcVar26;
  Expr *pEVar27;
  _Alloc_hider _Var28;
  Expr *pEVar29;
  char (*in_R8) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  Expr *pEVar30;
  Precedence PVar31;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_2;
  Node *c;
  pointer pNVar32;
  ulong uVar33;
  Var *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool bVar34;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view infix;
  string_view prefix_02;
  string_view infix_00;
  string_view y;
  string_view y_00;
  string_view infix_01;
  string_view prefix_03;
  string_view first_indent;
  string_view prefix_04;
  string_view prefix_05;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view sVar35;
  string decls;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  char *jmp;
  undefined4 uVar36;
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [2];
  string_view local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  Expr *local_140;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> local_138;
  Node *local_120;
  string local_118;
  Value *local_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  pointer local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar32 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar4 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_140 = (Expr *)parent;
  local_f0 = __return_storage_ptr__;
  if (pNVar32 != pNVar4) {
    do {
      DecompileExpr((Value *)local_1b8,this,pNVar32,n);
      std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
      emplace_back<wabt::Decompiler::Value>(&local_138,(Value *)local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      pNVar32 = pNVar32 + 1;
    } while (pNVar32 != pNVar4);
  }
  __return_storage_ptr___00 = local_f0;
  child = local_138.
          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
          _M_impl.super__Vector_impl_data._M_start;
  args_1 = &switchD_0012e3d2::switchdataD_0015acac;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/decompiler.cc"
                  ,0x19e,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"let ","");
    if ((n->u).field_0.var_count != 0) {
      uVar22 = 0;
      do {
        if (uVar22 != 0) {
          std::__cxx11::string::append(local_1b8);
        }
        TempVarName_abi_cxx11_((string *)&local_168,this,(n->u).field_0.var_start + uVar22);
        std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_len != &local_158) {
          operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < (n->u).field_0.var_count);
    }
    std::__cxx11::string::append(local_1b8);
    local_58 = 0;
    pcStack_50 = "";
    postfix._M_str._4_4_ = 0;
    postfix._0_12_ = ZEXT412(0x15b032) << 0x40;
    prefix._M_str = (char *)local_1b8._0_8_;
    prefix._M_len = local_1b8._8_8_;
    WrapNAry(__return_storage_ptr___00,this,&local_138,prefix,postfix,Assign);
    goto LAB_0012e7c7;
  case FlushedVar:
    TempVarName_abi_cxx11_((string *)local_1b8,this,(n->u).field_0.var_start);
LAB_0012e6c8:
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
LAB_0012e704:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    goto LAB_0012e7c7;
  case Statements:
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f0->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b8);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
    if ((n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar33 = 0;
      do {
        pEVar17 = ((intrusive_list_base<wabt::Expr> *)
                  ((long)local_138.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8))[uVar33 * 2].next_;
        cVar1 = pEVar17[-1].loc.filename._M_str[pEVar17[-1].loc.field_1.field_1.offset - 1];
        if ((cVar1 != ':') && (cVar1 != '}')) {
          std::__cxx11::string::push_back((char)pEVar17 + -0x20);
        }
        __args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&(local_138.
                           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v + uVar33 * 4 * 8);
        lVar23 = (long)((intrusive_list_base<wabt::Expr> *)
                       ((long)local_138.
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))[uVar33 * 2].next_ -
                 (long)__args >> 5;
        if (0 < lVar23) {
          uVar24 = lVar23 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr___00,__args);
            __args = __args + 1;
            uVar24 = uVar24 - 1;
          } while (1 < uVar24);
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 < (ulong)(((long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(n->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555));
    }
    goto LAB_0012eb0a;
  case EndReturn:
    local_68 = 0;
    pcStack_60 = "";
LAB_0012e5ae:
    pcVar21 = "return ";
    sVar19 = 7;
LAB_0012e5c6:
    postfix_00._M_str._4_4_ = 0;
    postfix_00._0_12_ = ZEXT412(0x15b032) << 0x40;
    prefix_00._M_str = pcVar21;
    prefix_00._M_len = sVar19;
    WrapNAry(local_f0,this,&local_138,prefix_00,postfix_00,None);
    goto LAB_0012eb0a;
  case Decl:
    if (((n->u).var)->type_ != Name) {
LAB_0012fe66:
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3f,"const std::string &wabt::Var::name() const");
    }
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pmVar14->defined = true;
    pVVar5 = (n->u).var;
    if (pVVar5->type_ != Name) goto LAB_0012fe66;
    pcVar6 = (pVVar5->field_2).name_._M_dataplus._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar6,pcVar6 + (pVVar5->field_2).name_._M_string_length);
    TVar15 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_118,TVar15);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x15b974);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar18) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1a8[0]._M_string_length = plVar13[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar13;
    }
    local_1b8._8_8_ = plVar13[1];
    *plVar13 = (long)paVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    uVar25 = local_118.field_2._M_allocated_capacity;
    _Var28._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0012eb0a;
    goto LAB_0012eb02;
  case DeclInit:
    if (((n->u).var)->type_ != Name) goto LAB_0012fe66;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&this->cur_ast->vars_defined,&(((n->u).var)->field_2).name_);
    pEVar17 = (Expr *)local_138.
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if (pmVar14->defined == true) {
      pVVar5 = (n->u).var;
      if (pVVar5->type_ != Name) goto LAB_0012fe66;
      name._M_str = (pVVar5->field_2).name_._M_dataplus._M_p;
      name._M_len = (pVVar5->field_2).name_._M_string_length;
      local_168 = VarName(this,name);
      cat<std::basic_string_view<char,std::char_traits<char>>,char[4]>
                ((string *)local_1b8,(wabt *)&local_168,
                 (basic_string_view<char,_std::char_traits<char>_> *)" = ",(char (*) [4])args_1);
      local_78 = 0;
      pcStack_70 = "";
      uVar22 = 0;
      uVar36 = 0x15b032;
      PVar31 = None;
      goto LAB_0012e7bf;
    }
    pVVar5 = (n->u).var;
    if (pVVar5->type_ != Name) goto LAB_0012fe66;
    pcVar6 = (pVVar5->field_2).name_._M_dataplus._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar6,pcVar6 + (pVVar5->field_2).name_._M_string_length);
    TVar15 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,&local_118,TVar15);
    cat<char[5],std::__cxx11::string,char[4]>
              ((string *)local_1b8,(wabt *)"var ",(char (*) [5])&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" = ",in_R8);
    local_88 = 0;
    pcStack_80 = "";
    postfix_02._M_str._4_4_ = 0;
    postfix_02._0_12_ = ZEXT412(0x15b032) << 0x40;
    prefix_02._M_str = (char *)local_1b8._0_8_;
    prefix_02._M_len = local_1b8._8_8_;
    WrapChild(__return_storage_ptr___00,this,(Value *)pEVar17,prefix_02,postfix_02,None);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    uVar25 = local_118.field_2._M_allocated_capacity;
    _Var28._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0012eb0a;
    goto LAB_0012eb02;
  }
  EVar2 = n->etype;
  switch(EVar2) {
  case Binary:
    if (n->e->type_ != Binary) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
LAB_00130064:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x48,pcVar21);
    }
    OpcodeToToken_abi_cxx11_((string *)local_1b8,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    iVar12 = std::__cxx11::string::compare((char *)local_1b8);
    PVar31 = Multiply;
    if (((iVar12 != 0) && (iVar12 = std::__cxx11::string::compare(local_1b8), iVar12 != 0)) &&
       (iVar12 = std::__cxx11::string::compare(local_1b8), iVar12 != 0)) {
      iVar12 = std::__cxx11::string::compare(local_1b8);
      PVar31 = Add;
      if ((iVar12 != 0) && (iVar12 = std::__cxx11::string::compare(local_1b8), iVar12 != 0)) {
        iVar12 = std::__cxx11::string::compare(local_1b8);
        PVar31 = Bit;
        if ((iVar12 != 0) &&
           ((iVar12 = std::__cxx11::string::compare(local_1b8), iVar12 != 0 &&
            (iVar12 = std::__cxx11::string::compare(local_1b8), iVar12 != 0)))) {
          iVar12 = std::__cxx11::string::compare(local_1b8);
          if (iVar12 != 0) {
            iVar12 = std::__cxx11::string::compare(local_1b8);
            PVar31 = OtherBin;
            if (iVar12 != 0) goto LAB_0012e924;
          }
          PVar31 = Shift;
        }
      }
    }
LAB_0012e924:
    infix._M_str = (char *)local_1b8._0_8_;
    infix._M_len = local_1b8._8_8_;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix,false,PVar31);
    uVar25 = local_1a8[0]._M_dataplus;
    _Var28._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) break;
    goto LAB_0012eb02;
  case Block:
    pEVar17 = n->e;
    if (pEVar17->type_ != Block) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    name_01._M_str = (char *)pEVar17[1]._vptr_Expr;
    name_01._M_len = (size_t)pEVar17[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_01);
    cat<char[7],std::basic_string_view<char,std::char_traits<char>>,char[2]>
              ((string *)local_1b8,(wabt *)"label ",(char (*) [7])&local_168,
               (basic_string_view<char,_std::char_traits<char>_> *)":",(char (*) [2])&local_168);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    if (((((local_140 != (Expr *)0x0) && (*(NodeType *)&local_140->_vptr_Expr != Statements)) &&
         (EVar2 = *(ExprType *)((long)&local_140->_vptr_Expr + 4), EVar2 != Block)) &&
        (EVar2 != Loop)) &&
       ((EVar2 != If ||
        ((((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
          &(local_140->super_intrusive_list_base<wabt::Expr>).prev_)->
         super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
         super__Vector_impl_data._M_start == n)))) {
      IndentValue(this,child,this->indent_amount,(string_view)ZEXT816(0));
      cVar9._M_current =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&child->v;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"{","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&child->v,cVar9,(value_type *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
      }
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
      }
    }
    PVar31 = Atomic;
    *(undefined4 *)&(((Location *)&child->precedence)->filename)._M_len = 10;
    pEVar17 = ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&child->v;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar17;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                   &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
                  super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    *(_func_int ***)&child->v = (_func_int **)0x0;
    ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_ = (Expr *)0x0;
    (((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
     &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
    super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    goto LAB_0012f7da;
  case Br:
    pEVar17 = n->e;
    if (pEVar17->type_ != Br) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Br>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    if (*(int *)&pEVar17[1].loc.filename._M_str != 1) goto LAB_0012fe66;
    pcVar21 = "goto ";
    if ((n->u).field_0.var_start == 3) {
      pcVar21 = "continue ";
    }
    name_00._M_str = (char *)pEVar17[1].loc.field_1.field_1.offset;
    name_00._M_len = *(size_t *)((long)&pEVar17[1].loc.field_1 + 8);
    sVar35 = VarName(this,name_00);
    y._M_str = *in_R8;
    y._M_len = (size_t)sVar35._M_str;
    operator+[abi_cxx11_((string *)local_1b8,(wabt *)pcVar21,(char *)sVar35._M_len,y);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
    goto LAB_0012e704;
  case BrIf:
    pEVar17 = n->e;
    if (pEVar17->type_ != BrIf) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::BrIf>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    local_118._M_dataplus._M_p = "goto";
    if ((n->u).field_0.var_start == 3) {
      local_118._M_dataplus._M_p = "continue";
    }
    if (*(int *)&pEVar17[1].loc.filename._M_str != 1) goto LAB_0012fe66;
    name_02._M_str = (char *)pEVar17[1].loc.field_1.field_1.offset;
    name_02._M_len = *(size_t *)((long)&pEVar17[1].loc.field_1 + 8);
    local_168 = VarName(this,name_02);
    cat<char[3],char_const*,char[2],std::basic_string_view<char,std::char_traits<char>>>
              ((string *)local_1b8,(wabt *)") ",(char (*) [3])&local_118,(char **)0x15b12f,
               (char (*) [2])&local_168,in_R9);
    local_a8 = (pointer)local_1b8._8_8_;
    paStack_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1b8._0_8_;
    postfix_03._M_str._0_4_ = (int)local_1b8._0_8_;
    postfix_03._M_len = local_1b8._8_8_;
    postfix_03._M_str._4_4_ = SUB84(local_1b8._0_8_,4);
    prefix_03._M_str = "if (";
    prefix_03._M_len = 4;
    WrapChild(__return_storage_ptr___00,this,child,prefix_03,postfix_03,None);
    goto LAB_0012e7c7;
  case BrTable:
    pEVar17 = n->e;
    if (pEVar17->type_ != BrTable) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BrTableExpr, Base = wabt::Expr]";
      goto LAB_00130064;
    }
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"br_table[","");
    pEVar29 = (Expr *)(((_Vector_base<wabt::Node,_std::allocator<wabt::Node>_> *)
                       &pEVar17[1]._vptr_Expr)->_M_impl).super__Vector_impl_data._M_start;
    pEVar30 = pEVar17[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_140 = pEVar17;
    if (pEVar29 != pEVar30) {
      do {
        if (*(int *)&(pEVar29->loc).filename._M_str != 1) goto LAB_0012fe66;
        name_03._M_str = (char *)(pEVar29->loc).field_1.field_1.offset;
        name_03._M_len = *(size_t *)((long)&(pEVar29->loc).field_1 + 8);
        sVar35 = VarName(this,name_03);
        std::__cxx11::string::append(local_1b8,(ulong)sVar35._M_str);
        std::__cxx11::string::append(local_1b8);
        pEVar29 = (Expr *)&pEVar29[1].super_intrusive_list_base<wabt::Expr>;
      } while (pEVar29 != pEVar30);
    }
    std::__cxx11::string::append(local_1b8);
    if (local_140[1].type_ != AtomicRmw) goto LAB_0012fe66;
    name_04._M_str = (char *)local_140[2]._vptr_Expr;
    name_04._M_len = (size_t)local_140[2].super_intrusive_list_base<wabt::Expr>.next_;
    sVar35 = VarName(this,name_04);
    std::__cxx11::string::append(local_1b8,(ulong)sVar35._M_str);
    std::__cxx11::string::append(local_1b8);
    local_d8 = 1;
    pcStack_d0 = ")";
    uVar22 = 1;
    uVar36 = 0x163045;
    PVar31 = Atomic;
    pEVar17 = (Expr *)local_138.
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_0012e7bf:
    postfix_01._M_str._0_4_ = uVar36;
    postfix_01._M_len = (ulong)uVar22;
    postfix_01._M_str._4_4_ = 0;
    prefix_01._M_str = (char *)local_1b8._0_8_;
    prefix_01._M_len = local_1b8._8_8_;
    WrapChild(__return_storage_ptr___00,this,(Value *)pEVar17,prefix_01,postfix_01,PVar31);
    goto LAB_0012e7c7;
  default:
    local_1b8._0_8_ = local_1a8;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    if ((int)EVar2 < 0x1c) {
      if (EVar2 != Call) {
        if (EVar2 != CallIndirect) {
          if (EVar2 == Convert) {
            pEVar17 = n->e;
            if (pEVar17->type_ != Convert) {
              pcVar21 = 
              "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Convert>, Base = wabt::Expr]"
              ;
              goto LAB_00130064;
            }
            goto LAB_0012fc8b;
          }
          goto switchD_0012f4f3_caseD_1d;
        }
        pcVar21 = "call_indirect";
        goto LAB_0012fdd2;
      }
      if (n->e->type_ != Call) {
        pcVar21 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Call>, Base = wabt::Expr]"
        ;
        goto LAB_00130064;
      }
      if (*(int *)&n->e[1].loc.filename._M_str != 1) goto LAB_0012fe66;
      std::__cxx11::string::_M_assign((string *)local_1b8);
    }
    else {
      switch(EVar2) {
      case MemoryCopy:
        pcVar21 = "memory_copy";
        break;
      case MemoryFill:
        pcVar21 = "memory_fill";
        break;
      case MemoryGrow:
        pcVar21 = "memory_grow";
        break;
      case MemorySize:
        pcVar21 = "memory_size";
        break;
      case RefIsNull:
        pcVar21 = "is_null";
        break;
      case ReturnCall:
        pEVar17 = n->e;
        if (pEVar17->type_ != ReturnCall) {
          pcVar21 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::ReturnCall>, Base = wabt::Expr]"
          ;
          goto LAB_00130064;
        }
        if (*(int *)&pEVar17[1].loc.filename._M_str != 1) goto LAB_0012fe66;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_168,"return_call ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pEVar17[1].loc.field_1.field_0);
        std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_len != &local_158) {
          operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
        }
        PVar31 = None;
        goto LAB_0012fddc;
      case ReturnCallIndirect:
        pcVar21 = "return_call call_indirect";
        break;
      case Select:
        pcVar21 = "select_if";
        break;
      default:
        if (EVar2 == Ternary) {
          pEVar17 = n->e;
          if (pEVar17->type_ != Ternary) {
            pcVar21 = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Ternary>, Base = wabt::Expr]"
            ;
            goto LAB_00130064;
          }
LAB_0012fc8b:
          OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&pEVar17->field_0x3c);
          std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_len != &local_158) {
            operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
          }
          goto LAB_0012fdd7;
        }
      case DataDrop:
      case MemoryInit:
      case Nop:
      case RefFunc:
      case RefNull:
      case Rethrow:
      case Return:
switchD_0012f4f3_caseD_1d:
        pcVar21 = GetExprTypeName(EVar2);
      }
LAB_0012fdd2:
      std::__cxx11::string::operator=((string *)local_1b8,pcVar21);
    }
LAB_0012fdd7:
    PVar31 = Atomic;
LAB_0012fddc:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "(");
    local_e8 = 1;
    pcStack_e0 = ")";
    postfix_04._M_str._0_4_ = 0x163045;
    postfix_04._M_len = 1;
    postfix_04._M_str._4_4_ = 0;
    prefix_05._M_str = (char *)local_168._M_len;
    prefix_05._M_len = (size_t)local_168._M_str;
    WrapNAry(__return_storage_ptr___00,this,&local_138,prefix_05,postfix_04,PVar31);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
LAB_0012fe46:
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
LAB_0012fe53:
    uVar25 = local_1a8[0]._M_dataplus;
    _Var28._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) break;
    goto LAB_0012eb02;
  case CodeMetadata:
    pEVar17 = n->e;
    if (pEVar17->type_ != CodeMetadata) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::CodeMetadataExpr, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    y_00._M_str = *in_R8;
    y_00._M_len = (size_t)pEVar17[1].super_intrusive_list_base<wabt::Expr>.next_;
    operator+[abi_cxx11_
              ((string *)&local_168,(wabt *)"// @metadata.code.",(char *)pEVar17[1]._vptr_Expr,y_00)
    ;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar18) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1a8[0]._M_string_length = puVar16[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar16;
    }
    local_1b8._8_8_ = puVar16[1];
    *puVar16 = paVar18;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    BinaryToString_abi_cxx11_
              ((string *)&local_168,this,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &pEVar17[1].super_intrusive_list_base<wabt::Expr>.prev_);
    std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      local_158._8_8_ = local_1a8[0]._M_string_length;
      local_1b8._0_8_ = &local_158;
    }
    local_158._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
    local_168._M_str = (char *)local_1b8._8_8_;
    local_168._M_len = local_1b8._0_8_;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity._0_4_ = Any;
    local_118.field_2._M_allocated_capacity._4_4_ = 0;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1a8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               (string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118);
    __return_storage_ptr___00->precedence = None;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) {
      operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
    }
    goto LAB_0012f992;
  case Compare:
    if (n->e->type_ != Compare) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Compare>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    OpcodeToToken_abi_cxx11_((string *)local_1b8,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    infix_01._M_str = (char *)local_1b8._0_8_;
    infix_01._M_len = local_1b8._8_8_;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix_01,false,Equal);
LAB_0012e7c7:
    uVar25 = local_1a8[0]._M_dataplus;
    _Var28._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
LAB_0012eb02:
      operator_delete(_Var28._M_p,uVar25 + 1);
    }
    break;
  case Const:
    pEVar17 = n->e;
    if (pEVar17->type_ != Const) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
      goto LAB_00130064;
    }
    switch(*(undefined4 *)&pEVar17[1].loc.filename._M_str) {
    case 0xfffffffb:
      pcVar26 = "V128";
      pcVar21 = "";
      goto LAB_0012eb43;
    case 0xfffffffc:
      to_string_abi_cxx11_((string *)local_1b8,this,*(double *)((long)&pEVar17[1].loc.field_1 + 8));
      goto LAB_0012e6c8;
    case 0xfffffffd:
      to_string_abi_cxx11_
                ((string *)&local_168,this,(double)*(float *)((long)&pEVar17[1].loc.field_1 + 8));
      break;
    case 0xfffffffe:
      std::__cxx11::to_string((string *)&local_168,*(long *)((long)&pEVar17[1].loc.field_1 + 8));
      break;
    case 0xffffffff:
      std::__cxx11::to_string((string *)local_1b8,pEVar17[1].loc.field_1.field_0.last_column);
      local_168 = (string_view)ZEXT816(0);
      local_158._M_allocated_capacity._0_4_ = Any;
      local_158._M_allocated_capacity._4_4_ = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
                 (string *)local_1b8,&local_1a8[0].field_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr___00->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_168);
      __return_storage_ptr___00->precedence = Atomic;
      goto LAB_0012e704;
    default:
      abort();
    }
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 == paVar18) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1a8[0]._M_string_length = puVar16[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar16;
    }
    local_1b8._8_8_ = puVar16[1];
    *puVar16 = paVar18;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    local_118.field_2._M_allocated_capacity._0_4_ = Any;
    local_118.field_2._M_allocated_capacity._4_4_ = 0;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               local_1b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118);
    __return_storage_ptr___00->precedence = Atomic;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
LAB_0012f849:
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    goto LAB_0012f856;
  case Drop:
    goto switchD_0012e805_caseD_13;
  case GlobalGet:
    if ((((VarExpr<(wabt::ExprType)20> *)n->e)->super_ExprMixin<(wabt::ExprType)20>).super_Expr.
        type_ != GlobalGet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalGet>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    Get<(wabt::ExprType)20>(local_f0,this,(VarExpr<(wabt::ExprType)20> *)n->e);
    break;
  case GlobalSet:
    if ((((VarExpr<(wabt::ExprType)21> *)n->e)->super_ExprMixin<(wabt::ExprType)21>).super_Expr.
        type_ != GlobalSet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalSet>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    Set<(wabt::ExprType)21>
              (local_f0,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)21> *)n->e);
    break;
  case If:
    if (n->e->type_ != If) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
      goto LAB_00130064;
    }
    pEVar17 = *(Expr **)&(local_138.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start)->v;
    pEVar29 = ((intrusive_list_base<wabt::Expr> *)
              ((long)local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start + 8))->next_;
    bVar34 = true;
    if ((ulong)((long)pEVar29 - (long)pEVar17) < 0x21) {
      bVar34 = 0x20 < (((Location *)
                       &(local_138.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start)->precedence)->field_1).field_1.
                      offset - (long)(((Location *)
                                      &(local_138.
                                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->precedence)->
                                     filename)._M_str;
    }
    pEVar27 = (Expr *)0x0;
    for (pEVar30 = pEVar17; pEVar30 != pEVar29; pEVar30 = (Expr *)&(pEVar30->loc).filename._M_str) {
      pEVar20 = (pEVar30->super_intrusive_list_base<wabt::Expr>).next_;
      if (pEVar27 <= pEVar20) {
        pEVar27 = pEVar20;
      }
    }
    sVar19 = n->e[4].loc.field_1.field_1.offset;
    pEVar30 = *(Expr **)&((Location *)
                         &(local_138.
                           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start)->precedence)->field_1;
    pEVar20 = (Expr *)0x0;
    for (pEVar29 = (Expr *)(((Location *)
                            &(local_138.
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start)->precedence)->filename).
                           _M_str; pEVar29 != pEVar30;
        pEVar29 = (Expr *)&(pEVar29->loc).filename._M_str) {
      pEVar8 = (pEVar29->super_intrusive_list_base<wabt::Expr>).next_;
      if (pEVar20 <= pEVar8) {
        pEVar20 = pEVar8;
      }
    }
    uVar33 = (long)&pEVar20->_vptr_Expr + (long)pEVar27;
    pEVar29 = (Expr *)((long)local_138.
                             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x40);
    if (sVar19 != 0) {
      pEVar20 = (((Expr *)((long)local_138.
                                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0x40))->
                super_intrusive_list_base<wabt::Expr>).next_;
      pEVar30 = (Expr *)0x0;
      pEVar27 = (Expr *)(((_Vector_base<wabt::Node,_std::allocator<wabt::Node>_> *)
                         &((Expr *)((long)local_138.
                                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x40))->
                          _vptr_Expr)->_M_impl).super__Vector_impl_data._M_start;
      for (pEVar8 = pEVar27; pEVar8 != pEVar20; pEVar8 = (Expr *)&(pEVar8->loc).filename._M_str) {
        pEVar10 = (pEVar8->super_intrusive_list_base<wabt::Expr>).next_;
        if (pEVar30 <= pEVar10) {
          pEVar30 = pEVar10;
        }
      }
      if (!bVar34) {
        uVar33 = (long)&pEVar30->_vptr_Expr + uVar33;
        bVar34 = 0x20 < (ulong)((long)pEVar20 - (long)pEVar27);
        goto LAB_0012f54c;
      }
LAB_0012f652:
      pLVar11 = (Location *)
                &(local_138.
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start)->precedence;
      first_indent._M_str = "if (";
      first_indent._M_len = 4;
      local_140 = pEVar29;
      IndentValue(this,local_138.
                       super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start,4,first_indent);
      std::__cxx11::string::append
                ((char *)&((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_[-1].loc.
                          filename._M_str);
      IndentValue(this,(Value *)&(pLVar11->filename)._M_str,this->indent_amount,
                  (string_view)ZEXT816(0));
      pNVar32 = (pointer)(((Location *)&child->precedence)->filename)._M_str;
      lVar23 = (long)((((Location *)&child->precedence)->field_1).field_1.offset - (long)pNVar32) >>
               5;
      if (0 < lVar23) {
        uVar33 = lVar23 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar32);
          pNVar32 = (pointer)&(pNVar32->children).
                              super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
          uVar33 = uVar33 - 1;
        } while (1 < uVar33);
      }
      if (sVar19 != 0) {
        local_1b8._0_8_ = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"} else {","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
            local_1a8) {
          operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
        }
        IndentValue(this,(Value *)local_140,this->indent_amount,(string_view)ZEXT816(0));
        pNVar32 = (((_Vector_base<wabt::Node,_std::allocator<wabt::Node>_> *)
                   &((Expr *)((long)child + 0x40))->_vptr_Expr)->_M_impl).super__Vector_impl_data.
                  _M_start;
        lVar23 = (long)(((Expr *)((long)child + 0x40))->super_intrusive_list_base<wabt::Expr>).next_
                 - (long)pNVar32 >> 5;
        if (0 < lVar23) {
          uVar33 = lVar23 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar32)
            ;
            pNVar32 = (pointer)((long)&(pNVar32->children).
                                       super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                       _M_impl + 0x10);
            uVar33 = uVar33 - 1;
          } while (1 < uVar33);
        }
      }
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
      }
      PVar31 = If;
      goto LAB_0012f7b8;
    }
LAB_0012f54c:
    if ((bVar34) || (this->target_exp_width < uVar33)) goto LAB_0012f652;
    cat<char[5],std::__cxx11::string,char[4]>
              ((string *)local_1b8,(wabt *)"if (",(char (*) [5])pEVar17,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") {",
               (char (*) [4])pEVar30);
    pNVar32 = (pointer)(((Location *)&child->precedence)->filename)._M_str;
    if (pNVar32 != (pointer)(((Location *)&child->precedence)->field_1).field_1.offset) {
      cat<char[2],std::__cxx11::string,char[2]>
                ((string *)&local_168,(wabt *)0x15b12f,(char (*) [2])pNVar32,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15b12f,
                 (char (*) [2])pEVar30);
      std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_len != &local_158) {
        operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append(local_1b8);
    if (sVar19 != 0) {
      cat<char[9],std::__cxx11::string,char[3]>
                ((string *)&local_168,(wabt *)" else { ",
                 (char (*) [9])
                 (((_Vector_base<wabt::Node,_std::allocator<wabt::Node>_> *)&pEVar29->_vptr_Expr)->
                 _M_impl).super__Vector_impl_data._M_start,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
                 (char (*) [3])pEVar30);
      std::__cxx11::string::_M_append(local_1b8,local_168._M_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_len != &local_158) {
        operator_delete((void *)local_168._M_len,local_158._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      local_158._8_8_ = local_1a8[0]._M_string_length;
      local_1b8._0_8_ = &local_158;
    }
    local_158._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
    local_168._M_str = (char *)local_1b8._8_8_;
    local_168._M_len = local_1b8._0_8_;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity._0_4_ = Any;
    local_118.field_2._M_allocated_capacity._4_4_ = 0;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1a8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               (string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118);
    __return_storage_ptr___00->precedence = If;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len != &local_158) goto LAB_0012fe46;
    goto LAB_0012fe53;
  case Load:
    pEVar17 = n->e;
    if (pEVar17->type_ != Load) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Load>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    local_140 = (Expr *)local_138.
                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    local_120 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar7 = pEVar17[2].loc.filename._M_len;
    OVar3.enum_ = *(Enum *)&pEVar17[2].super_intrusive_list_base<wabt::Expr>.next_;
    pEVar29 = pEVar17[2].super_intrusive_list_base<wabt::Expr>.prev_;
    Opcode::GetInfo((Info *)local_1b8,(Opcode *)&pEVar17[2].super_intrusive_list_base<wabt::Expr>);
    LoadStore(this,(Value *)local_140,local_120,uVar7,OVar3,(Address)pEVar29,
              (Type)local_1a8[0]._M_dataplus._M_p);
    goto switchD_0012e805_caseD_13;
  case LocalGet:
    if ((((VarExpr<(wabt::ExprType)24> *)n->e)->super_ExprMixin<(wabt::ExprType)24>).super_Expr.
        type_ != LocalGet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    Get<(wabt::ExprType)24>(local_f0,this,(VarExpr<(wabt::ExprType)24> *)n->e);
    break;
  case LocalSet:
    if ((((VarExpr<(wabt::ExprType)25> *)n->e)->super_ExprMixin<(wabt::ExprType)25>).super_Expr.
        type_ != LocalSet) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalSet>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    Set<(wabt::ExprType)25>
              (local_f0,this,
               local_138.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,(VarExpr<(wabt::ExprType)25> *)n->e);
    break;
  case LocalTee:
    ve = (VarExpr<(wabt::ExprType)26> *)n->e;
    if ((ve->super_ExprMixin<(wabt::ExprType)26>).super_Expr.type_ != LocalTee) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    if (local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_138.
        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Get<(wabt::ExprType)26>(local_f0,this,ve);
    }
    else {
      Set<(wabt::ExprType)26>
                (local_f0,this,
                 local_138.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start,ve);
    }
    break;
  case Loop:
    pEVar17 = n->e;
    if (pEVar17->type_ != Loop) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    IndentValue(this,local_138.
                     super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start,this->indent_amount,
                (string_view)ZEXT816(0));
    cVar9._M_current =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&child->v;
    name_05._M_str = (char *)pEVar17[1]._vptr_Expr;
    name_05._M_len = (size_t)pEVar17[1].super_intrusive_list_base<wabt::Expr>.next_;
    local_168 = VarName(this,name_05);
    cat<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
              ((string *)local_1b8,(wabt *)"loop ",(char (*) [6])&local_168,
               (basic_string_view<char,_std::char_traits<char>_> *)0x15b9de,(char (*) [3])&local_168
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&child->v,cVar9,(string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"}","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)child,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(long)local_1a8[0]._M_dataplus._M_p + 1);
    }
    PVar31 = Atomic;
LAB_0012f7b8:
    *(Precedence *)&(((Location *)&child->precedence)->filename)._M_len = PVar31;
    pEVar17 = ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&child->v;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar17;
    (__return_storage_ptr___00->v).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                   &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
                  super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    *(_func_int ***)&child->v = (_func_int **)0x0;
    ((intrusive_list_base<wabt::Expr> *)((long)child + 8))->next_ = (Expr *)0x0;
    (((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
     &((intrusive_list_base<wabt::Expr> *)((long)child + 8))->prev_)->
    super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
LAB_0012f7da:
    __return_storage_ptr___00->precedence = PVar31;
    break;
  case Nop:
    pcVar26 = "nop";
    pcVar21 = "";
    goto LAB_0012f35d;
  case RefNull:
    pcVar26 = "null";
    pcVar21 = "";
LAB_0012eb43:
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar26,pcVar21);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = Atomic;
    goto LAB_0012f3a3;
  case Rethrow:
    local_c8 = 0;
    pcStack_c0 = "";
    pcVar21 = "rethrow ";
    sVar19 = 8;
    goto LAB_0012e5c6;
  case Return:
    local_b8 = 0;
    pcStack_b0 = "";
    goto LAB_0012e5ae;
  case Store:
    pEVar17 = n->e;
    if (pEVar17->type_ != Store) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Store>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    local_140 = (Expr *)local_138.
                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    local_120 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar7 = pEVar17[2].loc.filename._M_len;
    OVar3.enum_ = *(Enum *)&pEVar17[2].super_intrusive_list_base<wabt::Expr>.next_;
    pEVar29 = pEVar17[2].super_intrusive_list_base<wabt::Expr>.prev_;
    Opcode::GetInfo((Info *)local_1b8,(Opcode *)&pEVar17[2].super_intrusive_list_base<wabt::Expr>);
    LoadStore(this,(Value *)local_140,local_120,uVar7,OVar3,(Address)pEVar29,
              (Type)local_1a8[0].field_2._0_8_);
    infix_00._M_str = "=";
    infix_00._M_len = 1;
    WrapBinary(__return_storage_ptr___00,this,&local_138,infix_00,true,Assign);
    break;
  case Unary:
    if (n->e->type_ != Unary) {
      pcVar21 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Unary>, Base = wabt::Expr]"
      ;
      goto LAB_00130064;
    }
    OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)*(Enum *)&n->e->field_0x3c);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_168);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar18) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1a8[0]._M_string_length = plVar13[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1a8;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar18->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar13;
    }
    local_1b8._8_8_ = plVar13[1];
    *plVar13 = (long)paVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_98 = 1;
    pcStack_90 = ")";
    sVar35._M_str._0_4_ = 0x163045;
    sVar35._M_len = 1;
    sVar35._M_str._4_4_ = 0;
    prefix_04._M_str = (char *)local_1b8._0_8_;
    prefix_04._M_len = local_1b8._8_8_;
    WrapChild(__return_storage_ptr___00,this,child,prefix_04,sVar35,Atomic);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) goto LAB_0012f849;
LAB_0012f856:
    uVar25 = local_158._M_allocated_capacity;
    _Var28._M_p = (pointer)local_168._M_len;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_len == &local_158) break;
    goto LAB_0012eb02;
  case Last:
    pcVar26 = "unreachable";
    pcVar21 = "";
LAB_0012f35d:
    local_1b8._0_8_ = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar26,pcVar21);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity._0_4_ = Any;
    local_158._M_allocated_capacity._4_4_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               (string *)local_1b8,&local_1a8[0].field_2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr___00->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    __return_storage_ptr___00->precedence = None;
LAB_0012f3a3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
LAB_0012f992:
    uVar25 = local_1a8[0]._M_dataplus;
    _Var28._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8) break;
    goto LAB_0012eb02;
  }
LAB_0012eb0a:
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector
            (&local_138);
  return __return_storage_ptr___00;
switchD_0012e805_caseD_13:
  pEVar17 = ((intrusive_list_base<wabt::Expr> *)
            ((long)local_138.
                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                   ._M_impl.super__Vector_impl_data._M_start + 8))->next_;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &(local_138.
          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
          _M_impl.super__Vector_impl_data._M_start)->v;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar17;
  (__return_storage_ptr___00->v).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                 &((intrusive_list_base<wabt::Expr> *)
                  ((long)local_138.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8))->prev_)->
                super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.
                super__Vector_impl_data._M_start;
  *(_func_int ***)
   &(local_138.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
     ._M_impl.super__Vector_impl_data._M_start)->v = (_func_int **)0x0;
  ((intrusive_list_base<wabt::Expr> *)
  ((long)local_138.
         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
         _M_impl.super__Vector_impl_data._M_start + 8))->next_ = (Expr *)0x0;
  (((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
   &((intrusive_list_base<wabt::Expr> *)
    ((long)local_138.
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
           _M_impl.super__Vector_impl_data._M_start + 8))->prev_)->
  super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  PVar31 = *(Precedence *)
            &(((Location *)
              &(local_138.
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                ._M_impl.super__Vector_impl_data._M_start)->precedence)->filename)._M_len;
  goto LAB_0012f7da;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) {
            decls += ", ";
          }
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value{{TempVarName(n.u.var_start)}, Precedence::Atomic};
      }
      case NodeType::Statements: {
        Value stats{{}, Precedence::None};
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') {
            s += ';';
          }
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{{"var " + LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var))},
                     Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(args[0],
                           cat("var ",
                               LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var)),
                               " = "),
                           "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, opcs, false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
        return WrapBinary(args, OpcodeToToken(ce.opcode), false,
                          Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        // BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, "=", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value* elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = std::string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(),
                      std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") {");
          if (!thenp.v.empty())
            s += cat(" ", thenp.v[0], " ");
          s += "}";
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
            cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements &&
            parent->etype != ExprType::Block &&
            parent->etype != ExprType::Loop &&
            (parent->etype != ExprType::If || &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (",
                         cat(") ", jmp, " ", VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto& v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      case ExprType::CodeMetadata: {
        auto cme = cast<CodeMetadataExpr>(n.e);
        std::string c = "// @metadata.code." + cme->name + " ";
        c += BinaryToString(cme->data);
        return Value{{std::move(c)}, Precedence::None};
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }